

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_wiener_denoise_2d
              (uint8_t **data,uint8_t **denoised,int w,int h,int *stride,int *chroma_sub,
              float **noise_psd,int block_size,int bit_depth,int use_highbd)

{
  ulong uVar1;
  size_t size;
  int iVar2;
  int iVar3;
  float *pfVar4;
  uint uVar5;
  void *__s;
  void *memblk;
  float *data_00;
  double *block;
  double *plane;
  float *memblk_00;
  aom_noise_tx_t *noise_tx;
  float *memblk_01;
  aom_noise_tx_t *noise_tx_00;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  float *pfVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  aom_noise_tx_t *local_1a8;
  int local_198;
  int local_194;
  int local_190;
  long local_158;
  long local_150;
  long local_f0;
  aom_flat_block_finder_t *local_d0;
  aom_flat_block_finder_t block_finder_chroma;
  aom_flat_block_finder_t block_finder_full;
  
  iVar2 = (block_size + w + -1) / block_size;
  iVar3 = (block_size + h + -1) / block_size;
  if (*chroma_sub == chroma_sub[1]) {
    uVar18 = (iVar2 + 2) * block_size;
    iVar16 = (iVar3 + 2) * block_size;
    uVar5 = aom_flat_block_finder_init(&block_finder_full,block_size,bit_depth,use_highbd);
    __s = aom_malloc((long)(int)(iVar16 * uVar18) << 2);
    uVar28 = block_size * block_size;
    memblk = aom_malloc((ulong)uVar28 * 4);
    data_00 = (float *)aom_memalign(0x20,(long)(int)(uVar28 * 2) << 2);
    size = (ulong)uVar28 * 8;
    block = (double *)aom_malloc(size);
    plane = (double *)aom_malloc(size);
    memblk_00 = get_half_cos_window(block_size);
    noise_tx = aom_noise_tx_malloc(block_size);
    noise_tx_00 = noise_tx;
    memblk_01 = memblk_00;
    if (*chroma_sub != 0) {
      uVar28 = aom_flat_block_finder_init
                         (&block_finder_chroma,block_size >> ((byte)*chroma_sub & 0x1f),bit_depth,
                          use_highbd);
      uVar5 = uVar5 & uVar28;
      memblk_01 = get_half_cos_window(block_size >> ((byte)*chroma_sub & 0x1f));
      noise_tx_00 = aom_noise_tx_malloc(block_size >> ((byte)*chroma_sub & 0x1f));
    }
    auVar38._0_4_ = -(uint)((int)memblk_00 == 0);
    auVar38._4_4_ = -(uint)((int)((ulong)memblk_00 >> 0x20) == 0);
    auVar38._8_4_ = -(uint)((int)memblk_01 == 0);
    auVar38._12_4_ = -(uint)((int)((ulong)memblk_01 >> 0x20) == 0);
    auVar40._4_4_ = auVar38._0_4_;
    auVar40._0_4_ = auVar38._4_4_;
    auVar40._8_4_ = auVar38._12_4_;
    auVar40._12_4_ = auVar38._8_4_;
    auVar37._0_4_ = -(uint)((int)data_00 == 0);
    auVar37._4_4_ = -(uint)((int)((ulong)data_00 >> 0x20) == 0);
    auVar37._8_4_ = -(uint)((int)block == 0);
    auVar37._12_4_ = -(uint)((int)((ulong)block >> 0x20) == 0);
    auVar39._4_4_ = auVar37._0_4_;
    auVar39._0_4_ = auVar37._4_4_;
    auVar39._8_4_ = auVar37._12_4_;
    auVar39._12_4_ = auVar37._8_4_;
    auVar40 = packssdw(auVar39 & auVar37,auVar40 & auVar38);
    auVar34._0_4_ = -(uint)((int)memblk == 0);
    auVar34._4_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0);
    auVar34._8_4_ = -(uint)((int)plane == 0);
    auVar34._12_4_ = -(uint)((int)((ulong)plane >> 0x20) == 0);
    auVar32._4_4_ = auVar34._0_4_;
    auVar32._0_4_ = auVar34._4_4_;
    auVar32._8_4_ = auVar34._12_4_;
    auVar32._12_4_ = auVar34._8_4_;
    auVar36._0_4_ = -(uint)((int)noise_tx == 0);
    auVar36._4_4_ = -(uint)((int)((ulong)noise_tx >> 0x20) == 0);
    auVar36._8_4_ = -(uint)((int)noise_tx_00 == 0);
    auVar36._12_4_ = -(uint)((int)((ulong)noise_tx_00 >> 0x20) == 0);
    auVar35._4_4_ = auVar36._0_4_;
    auVar35._0_4_ = auVar36._4_4_;
    auVar35._8_4_ = auVar36._12_4_;
    auVar35._12_4_ = auVar36._8_4_;
    auVar36 = packssdw(auVar35 & auVar36,auVar32 & auVar34);
    auVar36 = packssdw(auVar36,auVar40);
    uVar5 = (((((((((auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar36[0xf]) && __s != (void *)0x0) & uVar5;
    if (uVar5 != 0) {
      fVar33 = (float)~(-1 << ((byte)bit_depth & 0x1f));
      uVar25 = (ulong)uVar18;
      lVar10 = 0;
      do {
        bVar15 = 0;
        if (lVar10 == 0) {
          bVar11 = 0;
          pfVar4 = memblk_00;
LAB_008e3ee7:
          local_1a8 = noise_tx;
        }
        else {
          bVar15 = (byte)chroma_sub[1];
          bVar11 = (byte)*chroma_sub;
          pfVar4 = memblk_01;
          local_1a8 = noise_tx_00;
          if (*chroma_sub < 1) goto LAB_008e3ee7;
        }
        if ((data[lVar10] != (uint8_t *)0x0) && (denoised[lVar10] != (uint8_t *)0x0)) {
          local_d0 = &block_finder_full;
          if ((lVar10 != 0) && (local_d0 = &block_finder_chroma, *chroma_sub == 0)) {
            local_d0 = &block_finder_full;
          }
          memset(__s,0,(long)iVar16 * (long)(int)uVar18 * 4);
          uVar28 = block_size >> (bVar15 & 0x1f);
          if (0 < (int)uVar28) {
            uVar19 = block_size >> (bVar11 & 0x1f);
            uVar29 = uVar19 * uVar28;
            uVar22 = (ulong)uVar29;
            uVar12 = (int)(uVar19 - (block_size >> 0x1f)) >> 1;
            lVar17 = (long)(int)uVar19;
            local_158 = 0;
            local_198 = 0;
            do {
              if (0 < (int)uVar19) {
                local_190 = 0;
                local_f0 = local_158;
                do {
                  if (-1 < iVar3) {
                    local_194 = -1;
                    local_150 = local_f0;
                    do {
                      if (-1 < iVar2) {
                        iVar13 = -1;
                        lVar26 = local_150;
                        do {
                          aom_flat_block_finder_extract_block
                                    (local_d0,data[lVar10],w >> (bVar11 & 0x1f),h >> (bVar15 & 0x1f)
                                     ,stride[lVar10],uVar19 * iVar13 + local_190,
                                     local_194 * uVar28 + local_198,plane,block);
                          if (0 < (int)uVar29) {
                            uVar6 = 0;
                            do {
                              data_00[uVar6] = (float)block[uVar6];
                              *(float *)((long)memblk + uVar6 * 4) = (float)plane[uVar6];
                              uVar6 = uVar6 + 1;
                            } while (uVar22 != uVar6);
                          }
                          if ((int)uVar29 < 1) {
                            aom_noise_tx_forward(local_1a8,data_00);
                            aom_noise_tx_filter(local_1a8,noise_psd[lVar10]);
                            aom_noise_tx_inverse(local_1a8,data_00);
                          }
                          else {
                            uVar6 = 0;
                            do {
                              data_00[uVar6] = pfVar4[uVar6] * data_00[uVar6];
                              uVar6 = uVar6 + 1;
                            } while (uVar22 != uVar6);
                            aom_noise_tx_forward(local_1a8,data_00);
                            aom_noise_tx_filter(local_1a8,noise_psd[lVar10]);
                            aom_noise_tx_inverse(local_1a8,data_00);
                            if (0 < (int)uVar29) {
                              uVar6 = 0;
                              do {
                                *(float *)((long)memblk + uVar6 * 4) =
                                     pfVar4[uVar6] * *(float *)((long)memblk + uVar6 * 4);
                                uVar6 = uVar6 + 1;
                              } while (uVar22 != uVar6);
                            }
                          }
                          uVar6 = 0;
                          lVar7 = lVar26;
                          pfVar9 = data_00;
                          pvVar14 = memblk;
                          pfVar20 = pfVar4;
                          do {
                            uVar21 = 0;
                            do {
                              lVar24 = (long)((int)lVar7 + (int)uVar21);
                              *(float *)((long)__s + lVar24 * 4) =
                                   (pfVar9[uVar21] + *(float *)((long)pvVar14 + uVar21 * 4)) *
                                   pfVar20[uVar21] + *(float *)((long)__s + lVar24 * 4);
                              uVar21 = uVar21 + 1;
                            } while (uVar19 != uVar21);
                            uVar6 = uVar6 + 1;
                            pfVar20 = pfVar20 + lVar17;
                            pvVar14 = (void *)((long)pvVar14 + lVar17 * 4);
                            pfVar9 = pfVar9 + lVar17;
                            lVar7 = lVar7 + uVar25;
                          } while (uVar6 != uVar28);
                          iVar13 = iVar13 + 1;
                          lVar26 = lVar26 + (ulong)uVar19;
                        } while (iVar13 != iVar2);
                      }
                      local_194 = local_194 + 1;
                      local_150 = local_150 + (ulong)(uVar18 * uVar28);
                    } while (local_194 != iVar3);
                  }
                  local_190 = local_190 + uVar12;
                  local_f0 = local_f0 + (ulong)uVar12;
                } while (local_190 < (int)uVar19);
              }
              local_198 = local_198 + (uVar28 >> 1);
              local_158 = local_158 + (ulong)(uVar18 * (uVar28 >> 1));
            } while (local_198 < (int)uVar28);
          }
          uVar12 = h >> (bVar15 & 0x1f);
          puVar8 = denoised[lVar10];
          if (use_highbd == 0) {
            if (0 < (int)uVar12) {
              iVar13 = stride[lVar10];
              uVar19 = w >> (bVar11 & 0x1f);
              iVar23 = block_size >> (bVar11 & 0x1f);
              uVar22 = (ulong)((uVar28 + 1) * uVar18 + iVar23);
              uVar21 = (ulong)(uVar28 * uVar18 + iVar23);
              uVar6 = (ulong)(uint)(0 >> (bVar11 & 0x1f));
              do {
                if (0 < (int)uVar19) {
                  uVar27 = 0;
                  do {
                    iVar23 = (int)uVar27;
                    lVar17 = (long)((int)uVar21 + iVar23);
                    fVar31 = *(float *)((long)__s + lVar17 * 4);
                    fVar30 = fVar31 * fVar33 + 0.5;
                    if (fVar30 <= 0.0) {
                      fVar30 = 0.0;
                    }
                    if (fVar33 <= fVar30) {
                      fVar30 = fVar33;
                    }
                    fVar31 = (float)((int)fVar30 & 0xff) / fVar33 - fVar31;
                    puVar8[uVar27] = (uint8_t)(int)fVar30;
                    uVar1 = uVar27 + 1;
                    if ((long)uVar1 < (long)(int)uVar19) {
                      *(float *)((long)__s + lVar17 * 4 + 4) =
                           fVar31 * -7.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4 + 4);
                    }
                    if (uVar6 + 1 < (ulong)uVar12) {
                      if (uVar27 != 0) {
                        lVar17 = (long)((int)uVar22 + iVar23);
                        *(float *)((long)__s + lVar17 * 4 + -4) =
                             fVar31 * -3.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4 + -4);
                      }
                      lVar17 = (long)(iVar23 + (int)uVar22);
                      *(float *)((long)__s + lVar17 * 4) =
                           fVar31 * -5.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4);
                      if ((long)uVar1 < (long)(int)uVar19) {
                        *(float *)((long)__s + lVar17 * 4 + 4) =
                             fVar31 * -0.0625 + *(float *)((long)__s + lVar17 * 4 + 4);
                      }
                    }
                    uVar27 = uVar1;
                  } while (uVar19 != uVar1);
                }
                uVar6 = uVar6 + 1;
                puVar8 = puVar8 + iVar13;
                uVar22 = uVar22 + uVar25;
                uVar21 = uVar21 + uVar25;
              } while (uVar6 != uVar12);
            }
          }
          else if (0 < (int)uVar12) {
            uVar19 = w >> (bVar11 & 0x1f);
            iVar13 = stride[lVar10];
            iVar23 = block_size >> (bVar11 & 0x1f);
            uVar22 = (ulong)((uVar28 + 1) * uVar18 + iVar23);
            uVar21 = (ulong)(uVar28 * uVar18 + iVar23);
            uVar6 = (ulong)(uint)(0 >> (bVar11 & 0x1f));
            do {
              if (0 < (int)uVar19) {
                uVar27 = 0;
                do {
                  iVar23 = (int)uVar27;
                  lVar17 = (long)((int)uVar21 + iVar23);
                  fVar31 = *(float *)((long)__s + lVar17 * 4);
                  fVar30 = fVar31 * fVar33 + 0.5;
                  if (fVar30 <= 0.0) {
                    fVar30 = 0.0;
                  }
                  if (fVar33 <= fVar30) {
                    fVar30 = fVar33;
                  }
                  fVar31 = (float)((int)fVar30 & 0xffff) / fVar33 - fVar31;
                  *(short *)(puVar8 + uVar27 * 2) = (short)(int)fVar30;
                  uVar1 = uVar27 + 1;
                  if ((long)uVar1 < (long)(int)uVar19) {
                    *(float *)((long)__s + lVar17 * 4 + 4) =
                         fVar31 * -7.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4 + 4);
                  }
                  if (uVar6 + 1 < (ulong)uVar12) {
                    if (uVar27 != 0) {
                      lVar17 = (long)((int)uVar22 + iVar23);
                      *(float *)((long)__s + lVar17 * 4 + -4) =
                           fVar31 * -3.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4 + -4);
                    }
                    lVar17 = (long)(iVar23 + (int)uVar22);
                    *(float *)((long)__s + lVar17 * 4) =
                         fVar31 * -5.0 * 0.0625 + *(float *)((long)__s + lVar17 * 4);
                    if ((long)uVar1 < (long)(int)uVar19) {
                      *(float *)((long)__s + lVar17 * 4 + 4) =
                           fVar31 * -0.0625 + *(float *)((long)__s + lVar17 * 4 + 4);
                    }
                  }
                  uVar27 = uVar1;
                } while (uVar19 != uVar1);
              }
              uVar6 = uVar6 + 1;
              puVar8 = puVar8 + (long)iVar13 * 2;
              uVar22 = uVar22 + uVar25;
              uVar21 = uVar21 + uVar25;
            } while (uVar6 != uVar12);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
    }
    aom_free(__s);
    aom_free(memblk);
    aom_free(data_00);
    aom_free(plane);
    aom_free(block);
    aom_free(memblk_00);
    aom_noise_tx_free(noise_tx);
    aom_free(block_finder_full.A);
    aom_free(block_finder_full.AtA_inv);
    block_finder_full.num_params = 0;
    block_finder_full.block_size = 0;
    block_finder_full.normalization = 0.0;
    block_finder_full.AtA_inv = (double *)0x0;
    block_finder_full.A = (double *)0x0;
    block_finder_full.use_highbd = 0;
    block_finder_full._36_4_ = 0;
    if (*chroma_sub != 0) {
      aom_free(block_finder_chroma.A);
      aom_free(block_finder_chroma.AtA_inv);
      block_finder_chroma.num_params = 0;
      block_finder_chroma.block_size = 0;
      block_finder_chroma.normalization = 0.0;
      block_finder_chroma.AtA_inv = (double *)0x0;
      block_finder_chroma.A = (double *)0x0;
      block_finder_chroma.use_highbd = 0;
      block_finder_chroma._36_4_ = 0;
      aom_free(memblk_01);
      aom_noise_tx_free(noise_tx_00);
    }
  }
  else {
    aom_wiener_denoise_2d_cold_1();
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

int aom_wiener_denoise_2d(const uint8_t *const data[3], uint8_t *denoised[3],
                          int w, int h, int stride[3], int chroma_sub[2],
                          float *noise_psd[3], int block_size, int bit_depth,
                          int use_highbd) {
  float *plane = NULL, *block = NULL, *window_full = NULL,
        *window_chroma = NULL;
  double *block_d = NULL, *plane_d = NULL;
  struct aom_noise_tx_t *tx_full = NULL;
  struct aom_noise_tx_t *tx_chroma = NULL;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  const int result_stride = (num_blocks_w + 2) * block_size;
  const int result_height = (num_blocks_h + 2) * block_size;
  float *result = NULL;
  int init_success = 1;
  aom_flat_block_finder_t block_finder_full;
  aom_flat_block_finder_t block_finder_chroma;
  const float kBlockNormalization = (float)((1 << bit_depth) - 1);
  if (chroma_sub[0] != chroma_sub[1]) {
    fprintf(stderr,
            "aom_wiener_denoise_2d doesn't handle different chroma "
            "subsampling\n");
    return 0;
  }
  init_success &= aom_flat_block_finder_init(&block_finder_full, block_size,
                                             bit_depth, use_highbd);
  result = (float *)aom_malloc((num_blocks_h + 2) * block_size * result_stride *
                               sizeof(*result));
  plane = (float *)aom_malloc(block_size * block_size * sizeof(*plane));
  block =
      (float *)aom_memalign(32, 2 * block_size * block_size * sizeof(*block));
  block_d = (double *)aom_malloc(block_size * block_size * sizeof(*block_d));
  plane_d = (double *)aom_malloc(block_size * block_size * sizeof(*plane_d));
  window_full = get_half_cos_window(block_size);
  tx_full = aom_noise_tx_malloc(block_size);

  if (chroma_sub[0] != 0) {
    init_success &= aom_flat_block_finder_init(&block_finder_chroma,
                                               block_size >> chroma_sub[0],
                                               bit_depth, use_highbd);
    window_chroma = get_half_cos_window(block_size >> chroma_sub[0]);
    tx_chroma = aom_noise_tx_malloc(block_size >> chroma_sub[0]);
  } else {
    window_chroma = window_full;
    tx_chroma = tx_full;
  }

  init_success &= (tx_full != NULL) && (tx_chroma != NULL) && (plane != NULL) &&
                  (plane_d != NULL) && (block != NULL) && (block_d != NULL) &&
                  (window_full != NULL) && (window_chroma != NULL) &&
                  (result != NULL);
  for (int c = init_success ? 0 : 3; c < 3; ++c) {
    float *window_function = c == 0 ? window_full : window_chroma;
    aom_flat_block_finder_t *block_finder = &block_finder_full;
    const int chroma_sub_h = c > 0 ? chroma_sub[1] : 0;
    const int chroma_sub_w = c > 0 ? chroma_sub[0] : 0;
    struct aom_noise_tx_t *tx =
        (c > 0 && chroma_sub[0] > 0) ? tx_chroma : tx_full;
    if (!data[c] || !denoised[c]) continue;
    if (c > 0 && chroma_sub[0] != 0) {
      block_finder = &block_finder_chroma;
    }
    memset(result, 0, sizeof(*result) * result_stride * result_height);
    // Do overlapped block processing (half overlapped). The block rows can
    // easily be done in parallel
    for (int offsy = 0; offsy < (block_size >> chroma_sub_h);
         offsy += (block_size >> chroma_sub_h) / 2) {
      for (int offsx = 0; offsx < (block_size >> chroma_sub_w);
           offsx += (block_size >> chroma_sub_w) / 2) {
        // Pad the boundary when processing each block-set.
        for (int by = -1; by < num_blocks_h; ++by) {
          for (int bx = -1; bx < num_blocks_w; ++bx) {
            const int pixels_per_block =
                (block_size >> chroma_sub_w) * (block_size >> chroma_sub_h);
            aom_flat_block_finder_extract_block(
                block_finder, data[c], w >> chroma_sub_w, h >> chroma_sub_h,
                stride[c], bx * (block_size >> chroma_sub_w) + offsx,
                by * (block_size >> chroma_sub_h) + offsy, plane_d, block_d);
            for (int j = 0; j < pixels_per_block; ++j) {
              block[j] = (float)block_d[j];
              plane[j] = (float)plane_d[j];
            }
            pointwise_multiply(window_function, block, pixels_per_block);
            aom_noise_tx_forward(tx, block);
            aom_noise_tx_filter(tx, noise_psd[c]);
            aom_noise_tx_inverse(tx, block);

            // Apply window function to the plane approximation (we will apply
            // it to the sum of plane + block when composing the results).
            pointwise_multiply(window_function, plane, pixels_per_block);

            for (int y = 0; y < (block_size >> chroma_sub_h); ++y) {
              const int y_result =
                  y + (by + 1) * (block_size >> chroma_sub_h) + offsy;
              for (int x = 0; x < (block_size >> chroma_sub_w); ++x) {
                const int x_result =
                    x + (bx + 1) * (block_size >> chroma_sub_w) + offsx;
                result[y_result * result_stride + x_result] +=
                    (block[y * (block_size >> chroma_sub_w) + x] +
                     plane[y * (block_size >> chroma_sub_w) + x]) *
                    window_function[y * (block_size >> chroma_sub_w) + x];
              }
            }
          }
        }
      }
    }
    if (use_highbd) {
      dither_and_quantize_highbd(result, result_stride, (uint16_t *)denoised[c],
                                 w, h, stride[c], chroma_sub_w, chroma_sub_h,
                                 block_size, kBlockNormalization);
    } else {
      dither_and_quantize_lowbd(result, result_stride, denoised[c], w, h,
                                stride[c], chroma_sub_w, chroma_sub_h,
                                block_size, kBlockNormalization);
    }
  }
  aom_free(result);
  aom_free(plane);
  aom_free(block);
  aom_free(plane_d);
  aom_free(block_d);
  aom_free(window_full);

  aom_noise_tx_free(tx_full);

  aom_flat_block_finder_free(&block_finder_full);
  if (chroma_sub[0] != 0) {
    aom_flat_block_finder_free(&block_finder_chroma);
    aom_free(window_chroma);
    aom_noise_tx_free(tx_chroma);
  }
  return init_success;
}